

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void __thiscall cmExtraEclipseCDT4Generator::Generate(cmExtraEclipseCDT4Generator *this)

{
  cmLocalGenerator *this_00;
  bool bVar1;
  int iVar2;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *this_01;
  const_reference ppcVar3;
  cmMakefile *this_02;
  char *pcVar4;
  undefined8 uVar5;
  bool local_2b2;
  bool local_29a;
  allocator local_241;
  string local_240;
  allocator local_219;
  string local_218;
  byte local_1f3;
  byte local_1f2;
  allocator local_1f1;
  string local_1f0;
  byte local_1cb;
  byte local_1ca;
  allocator local_1c9;
  string local_1c8;
  allocator local_1a1;
  string local_1a0;
  int local_17c;
  undefined1 local_178 [4];
  int version;
  int local_154;
  int local_150;
  int res;
  uint minorVersion;
  uint majorVersion;
  RegularExpression regex;
  allocator local_61;
  string local_60;
  string local_40 [8];
  string eclipseVersion;
  cmMakefile *mf;
  cmLocalGenerator *lg;
  cmExtraEclipseCDT4Generator *this_local;
  
  this_01 = cmGlobalGenerator::GetLocalGenerators
                      ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  ppcVar3 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::operator[]
                      (this_01,0);
  this_00 = *ppcVar3;
  this_02 = cmLocalGenerator::GetMakefile(this_00);
  eclipseVersion.field_2._8_8_ = this_02;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"CMAKE_ECLIPSE_VERSION",&local_61);
  pcVar4 = cmMakefile::GetSafeDefinition(this_02,&local_60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,pcVar4,(allocator *)((long)&regex.searchstring + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&regex.searchstring + 3));
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  cmsys::RegularExpression::RegularExpression
            ((RegularExpression *)&minorVersion,".*([0-9]+\\.[0-9]+).*");
  pcVar4 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::RegularExpression::find((RegularExpression *)&minorVersion,pcVar4);
  if (bVar1) {
    res = 0;
    local_150 = 0;
    cmsys::RegularExpression::match_abi_cxx11_
              ((string *)local_178,(RegularExpression *)&minorVersion,1);
    uVar5 = std::__cxx11::string::c_str();
    iVar2 = __isoc99_sscanf(uVar5,"%u.%u",&res,&local_150);
    std::__cxx11::string::~string((string *)local_178);
    local_154 = iVar2;
    if (iVar2 == 2) {
      local_17c = res * 1000 + local_150;
      if (local_17c < 0xbbe) {
        this->SupportsVirtualFolders = false;
        this->SupportsMachO64Parser = false;
      }
      if (local_17c < 0xbbf) {
        this->SupportsGmakeErrorParser = false;
      }
    }
  }
  pcVar4 = cmLocalGenerator::GetSourceDirectory(this_00);
  std::__cxx11::string::operator=((string *)&this->HomeDirectory,pcVar4);
  pcVar4 = cmLocalGenerator::GetBinaryDirectory(this_00);
  std::__cxx11::string::operator=((string *)&this->HomeOutputDirectory,pcVar4);
  uVar5 = eclipseVersion.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1a0,"CMAKE_ECLIPSE_GENERATE_LINKED_RESOURCES",&local_1a1);
  bVar1 = cmMakefile::IsOn((cmMakefile *)uVar5,&local_1a0);
  this->GenerateLinkedResources = bVar1;
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  bVar1 = std::operator!=(&this->HomeDirectory,&this->HomeOutputDirectory);
  uVar5 = eclipseVersion.field_2._8_8_;
  this->IsOutOfSourceBuild = bVar1;
  local_1ca = 0;
  local_1cb = 0;
  local_29a = false;
  if ((this->IsOutOfSourceBuild & 1U) != 0) {
    std::allocator<char>::allocator();
    local_1ca = 1;
    std::__cxx11::string::string
              ((string *)&local_1c8,"CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT",&local_1c9);
    local_1cb = 1;
    local_29a = cmMakefile::IsOn((cmMakefile *)uVar5,&local_1c8);
  }
  this->GenerateSourceProject = local_29a;
  if ((local_1cb & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  if ((local_1ca & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  }
  uVar5 = eclipseVersion.field_2._8_8_;
  local_1f2 = 0;
  local_1f3 = 0;
  local_2b2 = false;
  if ((this->GenerateSourceProject & 1U) == 0) {
    std::allocator<char>::allocator();
    local_1f2 = 1;
    std::__cxx11::string::string
              ((string *)&local_1f0,"ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT",&local_1f1);
    local_1f3 = 1;
    local_2b2 = cmMakefile::IsOn((cmMakefile *)uVar5,&local_1f0);
  }
  if ((local_1f3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  if ((local_1f2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  }
  uVar5 = eclipseVersion.field_2._8_8_;
  if (local_2b2 != false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_218,
               "ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT is set to TRUE, but this variable is not supported anymore since CMake 2.8.7.\nEnable CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT instead."
               ,&local_219);
    cmMakefile::IssueMessage((cmMakefile *)uVar5,WARNING,&local_218,false);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator((allocator<char> *)&local_219);
  }
  bVar1 = cmsys::SystemTools::IsSubDirectory(&this->HomeOutputDirectory,&this->HomeDirectory);
  uVar5 = eclipseVersion.field_2._8_8_;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_240,
               "The build directory is a subdirectory of the source directory.\nThis is not supported well by Eclipse. It is strongly recommended to use a build directory which is a sibling of the source directory."
               ,&local_241);
    cmMakefile::IssueMessage((cmMakefile *)uVar5,WARNING,&local_240,false);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
  }
  if ((this->GenerateSourceProject & 1U) != 0) {
    CreateSourceProjectFile(this);
  }
  CreateProjectFile(this);
  CreateCProjectFile(this);
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)&minorVersion);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::Generate()
{
  cmLocalGenerator* lg = this->GlobalGenerator->GetLocalGenerators()[0];
  const cmMakefile* mf = lg->GetMakefile();

  std::string eclipseVersion = mf->GetSafeDefinition("CMAKE_ECLIPSE_VERSION");
  cmsys::RegularExpression regex(".*([0-9]+\\.[0-9]+).*");
  if (regex.find(eclipseVersion.c_str()))
    {
    unsigned int majorVersion = 0;
    unsigned int minorVersion = 0;
    int res=sscanf(regex.match(1).c_str(), "%u.%u", &majorVersion,
                                                    &minorVersion);
    if (res == 2)
      {
      int version = majorVersion * 1000 + minorVersion;
      if (version < 3006) // 3.6 is Helios
        {
        this->SupportsVirtualFolders = false;
        this->SupportsMachO64Parser = false;
        }
      if (version < 3007) // 3.7 is Indigo
        {
        this->SupportsGmakeErrorParser = false;
        }
      }
    }

  // TODO: Decide if these are local or member variables
  this->HomeDirectory       = lg->GetSourceDirectory();
  this->HomeOutputDirectory = lg->GetBinaryDirectory();

  this->GenerateLinkedResources = mf->IsOn(
                                    "CMAKE_ECLIPSE_GENERATE_LINKED_RESOURCES");

  this->IsOutOfSourceBuild = (this->HomeDirectory!=this->HomeOutputDirectory);

  this->GenerateSourceProject = (this->IsOutOfSourceBuild &&
                            mf->IsOn("CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT"));

  if ((this->GenerateSourceProject == false)
    && (mf->IsOn("ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT")))
    {
    mf->IssueMessage(cmake::WARNING,
              "ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT is set to TRUE, "
              "but this variable is not supported anymore since CMake 2.8.7.\n"
              "Enable CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT instead.");
    }

  if (cmSystemTools::IsSubDirectory(this->HomeOutputDirectory,
                                    this->HomeDirectory))
    {
    mf->IssueMessage(cmake::WARNING, "The build directory is a subdirectory "
                     "of the source directory.\n"
                     "This is not supported well by Eclipse. It is strongly "
                     "recommended to use a build directory which is a "
                     "sibling of the source directory.");
    }

  // NOTE: This is not good, since it pollutes the source tree. However,
  //       Eclipse doesn't allow CVS/SVN to work when the .project is not in
  //       the cvs/svn root directory. Hence, this is provided as an option.
  if (this->GenerateSourceProject)
    {
    // create .project file in the source tree
    this->CreateSourceProjectFile();
    }

  // create a .project file
  this->CreateProjectFile();

  // create a .cproject file
  this->CreateCProjectFile();
}